

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void wstran_pipe_recv(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  _Var1 = nni_aio_start(aio,wstran_pipe_recv_cancel,arg);
  if (_Var1) {
    *(nni_aio **)((long)arg + 0x38) = aio;
    nng_stream_recv(*(nng_stream **)((long)arg + 0x3d0),(nng_aio *)((long)arg + 0x208));
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
wstran_pipe_recv(void *arg, nni_aio *aio)
{
	ws_pipe *p = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&p->mtx);
	if (!nni_aio_start(aio, wstran_pipe_recv_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	p->user_rxaio = aio;
	nng_stream_recv(p->ws, &p->rxaio);
	nni_mtx_unlock(&p->mtx);
}